

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_haxe_generator.cc
# Opt level: O2

void __thiscall
t_haxe_generator::generate_deserialize_struct
          (t_haxe_generator *this,ostream *out,t_struct *tstruct,string *prefix)

{
  ostream *poVar1;
  string sStack_a8;
  string local_88;
  string local_68;
  string local_48;
  
  t_generator::indent_abi_cxx11_(&local_48,(t_generator *)this);
  poVar1 = std::operator<<(out,(string *)&local_48);
  poVar1 = std::operator<<(poVar1,(string *)prefix);
  poVar1 = std::operator<<(poVar1," = new ");
  type_name_abi_cxx11_(&local_88,this,&tstruct->super_t_type,false,false);
  get_cap_name(&local_68,this,&local_88);
  poVar1 = std::operator<<(poVar1,(string *)&local_68);
  poVar1 = std::operator<<(poVar1,"();");
  poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&sStack_a8,(t_generator *)this);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_a8);
  poVar1 = std::operator<<(poVar1,(string *)prefix);
  poVar1 = std::operator<<(poVar1,".read(iprot);");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_a8);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void t_haxe_generator::generate_deserialize_struct(ostream& out,
                                                   t_struct* tstruct,
                                                   string prefix) {
  out << indent() << prefix << " = new " << get_cap_name(type_name(tstruct)) << "();" << endl
      << indent() << prefix << ".read(iprot);" << endl;
}